

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdPath.c
# Opt level: O0

void Sbc_ManAddInternalToPath(Gia_Man_t *p,Vec_Bit_t *vPath)

{
  int iVar1;
  int *piVar2;
  int local_24;
  int iObj;
  int iFan;
  int k;
  Vec_Bit_t *vPath_local;
  Gia_Man_t *p_local;
  
  for (local_24 = 1; iVar1 = Gia_ManObjNum(p), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Gia_ObjIsLut(p,local_24);
    if ((iVar1 != 0) && (iVar1 = Vec_BitEntry(vPath,local_24), iVar1 != 0)) {
      Gia_ManIncrementTravId(p);
      for (iObj = 0; iVar1 = Gia_ObjLutSize(p,local_24), iObj < iVar1; iObj = iObj + 1) {
        piVar2 = Gia_ObjLutFanins(p,local_24);
        Gia_ObjSetTravIdCurrentId(p,piVar2[iObj]);
      }
      Sbc_ManAddInternalToPath_rec(p,local_24,vPath);
    }
  }
  return;
}

Assistant:

void Sbc_ManAddInternalToPath( Gia_Man_t * p, Vec_Bit_t * vPath )
{
    int k, iFan, iObj;
    Gia_ManForEachLut( p, iObj )
    {
        if ( !Vec_BitEntry(vPath, iObj) )
            continue;
        Gia_ManIncrementTravId( p );
        Gia_LutForEachFanin( p, iObj, iFan, k )
            Gia_ObjSetTravIdCurrentId(p, iFan);
        Sbc_ManAddInternalToPath_rec( p, iObj, vPath );
    }
}